

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O2

LispPTR compare_lisp_chars(char *char1,char *char2,DLword length,DLword fat1,DLword fat2)

{
  LispPTR LVar1;
  undefined6 in_register_0000000a;
  int iVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  undefined2 in_register_00000082;
  
  uVar3 = CONCAT62(in_register_00000012,length);
  if (((int)CONCAT62(in_register_0000000a,fat1) == 0) == (CONCAT22(in_register_00000082,fat2) != 0))
  {
    if (fat1 == 0) {
      LVar1 = lispcmp((DLword *)char2,char1,(int)uVar3);
      return LVar1;
    }
    LVar1 = lispcmp((DLword *)char1,char2,(int)uVar3);
    return LVar1;
  }
  if (fat1 == 0) {
    while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
      if (*(char *)((ulong)char1 ^ 3) != *(char *)((ulong)char2 ^ 3)) {
        return 0;
      }
      char2 = char2 + 1;
      char1 = char1 + 1;
    }
  }
  else {
    while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
      if (*(short *)((ulong)char1 ^ 2) != *(short *)((ulong)char2 ^ 2)) {
        return 0;
      }
      char2 = char2 + 2;
      char1 = char1 + 2;
    }
  }
  return 1;
}

Assistant:

LispPTR compare_lisp_chars(const char *char1, const char *char2, DLword length,
                           DLword fat1, DLword fat2) {
  if ((!fat1) == (!fat2)) { /* both fat or both non-fat. */
#ifdef BYTESWAP
    if (fat1) { /* both fat, so compare 'em a word at a time */
      int i;
      for (i = 0; i < length; i++) {
        if (GETWORD(char1) != GETWORD(char2)) return (NIL);
        /* increment by size of fat character, i.e., DLword, 2 bytes */
        char1+= sizeof(DLword); char2+=sizeof(DLword);
      }
      return (T);
    } else { /* both thin, so compare 'em a byte at a time */
             /* (it's this way in case we're byte-swapped.)*/
      int i;
      for (i = 0; i < length; i++)
        if (GETBYTE(char1++) != GETBYTE(char2++)) return (NIL);
      return (T);
    }
#else
    /* This one fails for byte-swapped machines */
    if (fat1) length = length + length;
    if (memcmp(char1, char2, length) == 0)
      return (T);
    else {
      return (NIL);
    }
#endif /* BYTESWAP */

  } else if (fat1) { /* char1 is fat, char2 isn't */
      if (lispcmp((const DLword *)char1, char2, length))
      return (T);
    else
      return (NIL);
  } else { /* char2 is fat, char1 isn't */
      if (lispcmp((const DLword *)char2, char1, length))
      return (T);
    else
      return (NIL);
  }

}